

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

int __thiscall google::protobuf::internal::ExtensionSet::NumExtensions(ExtensionSet *this)

{
  _Rb_tree_node_base *p_Var1;
  int iVar2;
  
  iVar2 = 0;
  for (p_Var1 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    iVar2 = iVar2 + (~(uint)*(byte *)((long)&p_Var1[1]._M_left + 2) & 1);
  }
  return iVar2;
}

Assistant:

int ExtensionSet::NumExtensions() const {
  int result = 0;
  for (map<int, Extension>::const_iterator iter = extensions_.begin();
       iter != extensions_.end(); ++iter) {
    if (!iter->second.is_cleared) {
      ++result;
    }
  }
  return result;
}